

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_transaction_base.cpp
# Opt level: O3

Script * cfd::api::SetP2shMultisigUnlockingScript
                   (Script *__return_storage_ptr__,
                   vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *signature_data
                   ,Script *redeem_script)

{
  pointer pBVar1;
  Script *pSVar2;
  Script *extraout_RAX;
  ByteData *signature;
  pointer data;
  ScriptBuilder sb;
  ScriptBuilder local_50;
  
  local_50._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
  local_50.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  core::ScriptBuilder::AppendOperator(&local_50,(ScriptOperator *)core::ScriptOperator::OP_0);
  data = (signature_data->
         super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pBVar1 = (signature_data->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (data != pBVar1) {
    do {
      core::ScriptBuilder::AppendData(&local_50,data);
      data = data + 1;
    } while (data != pBVar1);
  }
  core::ScriptBuilder::AppendData(&local_50,redeem_script);
  pSVar2 = core::ScriptBuilder::Build(__return_storage_ptr__,&local_50);
  local_50._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
  if (local_50.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pSVar2 = extraout_RAX;
  }
  return pSVar2;
}

Assistant:

static Script SetP2shMultisigUnlockingScript(
    const std::vector<ByteData>& signature_data, const Script& redeem_script) {
  ScriptBuilder sb;
  sb.AppendOperator(ScriptOperator::OP_0);
  for (const ByteData& signature : signature_data) {
    sb.AppendData(signature);
  }
  sb.AppendData(redeem_script);
  return sb.Build();
}